

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O1

void * upb_global_allocfunc(upb_alloc *alloc,void *ptr,size_t oldsize,size_t size)

{
  void *pvVar1;
  
  if (size != 0) {
    pvVar1 = realloc(ptr,size);
    return pvVar1;
  }
  free(ptr);
  return (void *)0x0;
}

Assistant:

static void* upb_global_allocfunc(upb_alloc* alloc, void* ptr, size_t oldsize,
                                  size_t size) {
  UPB_UNUSED(alloc);
  UPB_UNUSED(oldsize);
  if (size == 0) {
    free(ptr);
    return NULL;
  } else {
    return realloc(ptr, size);
  }
}